

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O0

int stbi__process_marker(stbi__jpeg *z,int m)

{
  bool bVar1;
  stbi__huffman *psVar2;
  stbi_uc sVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ushort local_b4;
  int local_ac;
  int i_3;
  int ok_1;
  int i_2;
  int ok;
  int th;
  int tc;
  int q_1;
  int n;
  int i_1;
  int sizes [16];
  stbi_uc *local_40;
  stbi_uc *v;
  int i;
  int t;
  int sixteen;
  int p;
  int q;
  int L;
  int m_local;
  stbi__jpeg *z_local;
  
  if (m == 0xc4) {
    iVar8 = stbi__get16be(z->s);
    for (p = iVar8 + -2; 0 < p; p = (p + -0x11) - tc) {
      tc = 0;
      bVar4 = stbi__get8(z->s);
      uVar5 = (int)(uint)bVar4 >> 4;
      uVar7 = bVar4 & 0xf;
      if ((1 < uVar5) || (3 < uVar7)) {
        iVar8 = stbi__err("bad DHT header");
        return iVar8;
      }
      for (q_1 = 0; q_1 < 0x10; q_1 = q_1 + 1) {
        bVar4 = stbi__get8(z->s);
        (&n)[q_1] = (uint)bVar4;
        tc = (&n)[q_1] + tc;
      }
      if (0x100 < tc) {
        iVar8 = stbi__err("bad DHT header");
        return iVar8;
      }
      if (uVar5 == 0) {
        iVar8 = stbi__build_huffman(z->huff_dc + (int)uVar7,&n);
        if (iVar8 == 0) {
          return 0;
        }
        psVar2 = z->huff_dc + (int)uVar7;
      }
      else {
        iVar8 = stbi__build_huffman(z->huff_ac + (int)uVar7,&n);
        if (iVar8 == 0) {
          return 0;
        }
        psVar2 = z->huff_ac + (int)uVar7;
      }
      local_40 = psVar2->values;
      for (q_1 = 0; q_1 < tc; q_1 = q_1 + 1) {
        sVar3 = stbi__get8(z->s);
        local_40[q_1] = sVar3;
      }
      if (uVar5 != 0) {
        stbi__build_fast_ac(z->fast_ac[(int)uVar7],z->huff_ac + (int)uVar7);
      }
    }
    z_local._4_4_ = (uint)(p == 0);
  }
  else if (m == 0xdb) {
    iVar8 = stbi__get16be(z->s);
    for (p = iVar8 + -2; 0 < p; p = p - iVar6) {
      bVar4 = stbi__get8(z->s);
      iVar8 = (int)(uint)bVar4 >> 4;
      uVar5 = bVar4 & 0xf;
      if ((iVar8 != 0) && (iVar8 != 1)) {
        iVar8 = stbi__err("bad DQT type");
        return iVar8;
      }
      if (3 < uVar5) {
        iVar8 = stbi__err("bad DQT table");
        return iVar8;
      }
      for (v._4_4_ = 0; v._4_4_ < 0x40; v._4_4_ = v._4_4_ + 1) {
        if (iVar8 != 0) {
          iVar6 = stbi__get16be(z->s);
          local_b4 = (ushort)iVar6;
        }
        else {
          bVar4 = stbi__get8(z->s);
          local_b4 = (ushort)bVar4;
        }
        z->dequant[(int)uVar5][""[v._4_4_]] = local_b4;
      }
      iVar6 = 0x41;
      if (iVar8 != 0) {
        iVar6 = 0x81;
      }
    }
    z_local._4_4_ = (uint)(p == 0);
  }
  else if (m == 0xdd) {
    iVar8 = stbi__get16be(z->s);
    if (iVar8 == 4) {
      iVar8 = stbi__get16be(z->s);
      z->restart_interval = iVar8;
      z_local._4_4_ = 1;
    }
    else {
      z_local._4_4_ = stbi__err("bad DRI len");
    }
  }
  else if (m == 0xff) {
    z_local._4_4_ = stbi__err("expected marker");
  }
  else if (((m < 0xe0) || (0xef < m)) && (m != 0xfe)) {
    z_local._4_4_ = stbi__err("unknown marker");
  }
  else {
    iVar8 = stbi__get16be(z->s);
    if (iVar8 < 2) {
      if (m == 0xfe) {
        z_local._4_4_ = stbi__err("bad COM len");
      }
      else {
        z_local._4_4_ = stbi__err("bad APP len");
      }
    }
    else {
      p = iVar8 + -2;
      if ((m == 0xe0) && (4 < p)) {
        bVar1 = true;
        for (i_3 = 0; i_3 < 5; i_3 = i_3 + 1) {
          sVar3 = stbi__get8(z->s);
          if (sVar3 != "JFIF"[i_3]) {
            bVar1 = false;
          }
        }
        p = iVar8 + -7;
        if (bVar1) {
          z->jfif = 1;
        }
      }
      else if ((m == 0xee) && (0xb < p)) {
        bVar1 = true;
        for (local_ac = 0; local_ac < 6; local_ac = local_ac + 1) {
          sVar3 = stbi__get8(z->s);
          if (sVar3 != "Adobe"[local_ac]) {
            bVar1 = false;
          }
        }
        p = iVar8 + -8;
        if (bVar1) {
          stbi__get8(z->s);
          stbi__get16be(z->s);
          stbi__get16be(z->s);
          bVar4 = stbi__get8(z->s);
          z->app14_color_transform = (uint)bVar4;
          p = iVar8 + -0xe;
        }
      }
      stbi__skip(z->s,p);
      z_local._4_4_ = 1;
    }
  }
  return z_local._4_4_;
}

Assistant:

static int stbi__process_marker(stbi__jpeg *z, int m)
{
   int L;
   switch (m) {
      case STBI__MARKER_none: // no marker found
         return stbi__err("expected marker","Corrupt JPEG");

      case 0xDD: // DRI - specify restart interval
         if (stbi__get16be(z->s) != 4) return stbi__err("bad DRI len","Corrupt JPEG");
         z->restart_interval = stbi__get16be(z->s);
         return 1;

      case 0xDB: // DQT - define quantization table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            int q = stbi__get8(z->s);
            int p = q >> 4, sixteen = (p != 0);
            int t = q & 15,i;
            if (p != 0 && p != 1) return stbi__err("bad DQT type","Corrupt JPEG");
            if (t > 3) return stbi__err("bad DQT table","Corrupt JPEG");

            for (i=0; i < 64; ++i)
               z->dequant[t][stbi__jpeg_dezigzag[i]] = (stbi__uint16)(sixteen ? stbi__get16be(z->s) : stbi__get8(z->s));
            L -= (sixteen ? 129 : 65);
         }
         return L==0;

      case 0xC4: // DHT - define huffman table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            stbi_uc *v;
            int sizes[16],i,n=0;
            int q = stbi__get8(z->s);
            int tc = q >> 4;
            int th = q & 15;
            if (tc > 1 || th > 3) return stbi__err("bad DHT header","Corrupt JPEG");
            for (i=0; i < 16; ++i) {
               sizes[i] = stbi__get8(z->s);
               n += sizes[i];
            }
            if(n > 256) return stbi__err("bad DHT header","Corrupt JPEG"); // Loop over i < n would write past end of values!
            L -= 17;
            if (tc == 0) {
               if (!stbi__build_huffman(z->huff_dc+th, sizes)) return 0;
               v = z->huff_dc[th].values;
            } else {
               if (!stbi__build_huffman(z->huff_ac+th, sizes)) return 0;
               v = z->huff_ac[th].values;
            }
            for (i=0; i < n; ++i)
               v[i] = stbi__get8(z->s);
            if (tc != 0)
               stbi__build_fast_ac(z->fast_ac[th], z->huff_ac + th);
            L -= n;
         }
         return L==0;
   }

   // check for comment block or APP blocks
   if ((m >= 0xE0 && m <= 0xEF) || m == 0xFE) {
      L = stbi__get16be(z->s);
      if (L < 2) {
         if (m == 0xFE)
            return stbi__err("bad COM len","Corrupt JPEG");
         else
            return stbi__err("bad APP len","Corrupt JPEG");
      }
      L -= 2;

      if (m == 0xE0 && L >= 5) { // JFIF APP0 segment
         static const unsigned char tag[5] = {'J','F','I','F','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 5; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 5;
         if (ok)
            z->jfif = 1;
      } else if (m == 0xEE && L >= 12) { // Adobe APP14 segment
         static const unsigned char tag[6] = {'A','d','o','b','e','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 6; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 6;
         if (ok) {
            stbi__get8(z->s); // version
            stbi__get16be(z->s); // flags0
            stbi__get16be(z->s); // flags1
            z->app14_color_transform = stbi__get8(z->s); // color transform
            L -= 6;
         }
      }

      stbi__skip(z->s, L);
      return 1;
   }

   return stbi__err("unknown marker","Corrupt JPEG");
}